

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O3

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_NormalizeLanguageTag
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  charcount_t cVar5;
  charcount_t cVar6;
  charcount_t cVar7;
  uint uVar8;
  BOOL BVar9;
  undefined4 *puVar10;
  Var pvVar11;
  JavascriptString *pJVar12;
  undefined4 extraout_var;
  LPCSTR pCVar13;
  Recycler *this;
  char16 *content;
  ulong uVar14;
  uint uVar15;
  size_t size;
  long lVar16;
  ulong uVar17;
  uint in_stack_00000010;
  char16_t *local_1e8;
  char localeID [157];
  undefined1 local_140 [8];
  TrackAllocData data;
  char canonicalized [157];
  WideToNarrow langtag8;
  Arguments args;
  charcount_t local_38;
  int local_34;
  int parsedLength;
  UErrorCode status;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  uVar8 = callInfo._0_4_;
  if (in_stack_00000010 != uVar8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x38c,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00b50497;
    *puVar10 = 0;
  }
  langtag8._24_8_ = callInfo;
  if ((uVar8 >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x38c,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00b50497;
    *puVar10 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((uVar8 & 0xffffff) == 2) {
    pvVar11 = Arguments::operator[]((Arguments *)&langtag8.freeDst,1);
    bVar3 = VarIs<Js::JavascriptString>(pvVar11);
    if (!bVar3) goto LAB_00b4fe67;
  }
  else {
    if (((ulong)callInfo & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x38c,"(argCount > 0)","Should always have implicit \'this\'");
      if (!bVar3) goto LAB_00b50497;
      *puVar10 = 0;
    }
LAB_00b4fe67:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x38f,
                                "((args.Info.Count == 2 && VarIs<JavascriptString>(args[1])))",
                                "Intl platform function given bad arguments");
    if (!bVar3) goto LAB_00b50497;
    *puVar10 = 0;
  }
  local_34 = 0;
  pvVar11 = Arguments::operator[]((Arguments *)&langtag8.freeDst,1);
  pJVar12 = UnsafeVarTo<Js::JavascriptString>(pvVar11);
  iVar4 = (*(pJVar12->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pJVar12);
  local_1e8 = (char16_t *)CONCAT44(extraout_var,iVar4);
  cVar5 = JavascriptString::GetLength(pJVar12);
  stack0xffffffffffffff88 = (void *)0x0;
  utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char16_t_*,_char_*,_unsigned_long>::
  Initialize((NarrowWideConverter<utf8::malloc_allocator,_const_char16_t_*,_char_*,_unsigned_long> *
             )(canonicalized + 0x98),&local_1e8,(ulong)cVar5);
  local_38 = 0;
  memset(&local_1e8,0,0x9d);
  iVar4 = uloc_forLanguageTag_70(stack0xffffffffffffff88,&local_1e8,0x9d,&local_38,&local_34);
  if ((int)local_38 < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x39c,"(parsedLength >= 0)","parsedLength >= 0");
    if (!bVar3) goto LAB_00b50497;
    *puVar10 = 0;
  }
  cVar5 = local_38;
  if ((local_34 == 1) ||
     (cVar6 = JavascriptString::GetLength(pJVar12), cVar7 = local_38, cVar5 < cVar6)) {
    pJVar12 = (JavascriptString *)
              (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
              undefinedValue.ptr;
    goto LAB_00b503b9;
  }
  if (local_34 == 7) {
    Throw::OutOfMemory();
  }
  if (local_34 < 1 && local_34 != -0x7c) {
    if ((iVar4 < 0) ||
       ((cVar6 = JavascriptString::GetLength(pJVar12), cVar5 = local_38, cVar7 != cVar6 &&
        (cVar7 = JavascriptString::GetLength(pJVar12), cVar5 != cVar7)))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x3ad,
                                  "(forLangTagResultLength >= 0 && ((charcount_t) parsedLength) == langtag->GetLength())"
                                  ,
                                  "forLangTagResultLength >= 0 && ((charcount_t) parsedLength) == langtag->GetLength()"
                                 );
      goto LAB_00b500a3;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    pCVar13 = (LPCSTR)u_errorName_70(local_34);
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x3ad,"(false)",pCVar13);
LAB_00b500a3:
    if (bVar3 == false) goto LAB_00b50497;
    *puVar10 = 0;
  }
  memset(&data.line,0,0x9d);
  uVar8 = uloc_toLanguageTag_70(&local_1e8,&data.line,0x9d,1);
  uVar17 = (ulong)uVar8;
  if (local_34 == 7) {
    Throw::OutOfMemory();
  }
  if (local_34 < 1 && local_34 != -0x7c) {
    if ((int)uVar8 < 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x3b1,"(toLangTagResultLength > 0)","toLangTagResultLength > 0");
      goto LAB_00b5019a;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    pCVar13 = (LPCSTR)u_errorName_70(local_34);
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x3b1,"(false)",pCVar13);
LAB_00b5019a:
    if (bVar3 == false) goto LAB_00b50497;
    *puVar10 = 0;
  }
  iVar4 = uVar8 + 1;
  local_140 = (undefined1  [8])&char16_t::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_66fc5bd;
  data.filename._0_4_ = 0x3b4;
  data.plusSize = (long)iVar4;
  this = Memory::Recycler::TrackAllocInfo(pSVar1->recycler,(TrackAllocData *)local_140);
  if (iVar4 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this,(TrackAllocData *)0x0);
    content = (char16 *)&DAT_00000008;
LAB_00b50299:
    *content = L'\0';
LAB_00b5029f:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x3bd,
                                "(hr == ((HRESULT)0x00000000L) && ((int) canonicalized16Len) == toLangTagResultLength)"
                                ,
                                "hr == ((HRESULT)0x00000000L) && ((int) canonicalized16Len) == toLangTagResultLength"
                               );
    if (!bVar3) {
LAB_00b50497:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar10 = 0;
  }
  else {
    size = 0xffffffffffffffff;
    if (-1 < iVar4) {
      size = (long)iVar4 * 2;
    }
    BVar9 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar9 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00b50497;
      *puVar10 = 0;
    }
    content = (char16 *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                        (this,size);
    if (content == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) goto LAB_00b50497;
      *puVar10 = 0;
      if (-1 < (int)uVar8) {
        content = (char16 *)0x0;
        goto LAB_00b5029f;
      }
      goto LAB_00b50299;
    }
    if ((int)uVar8 < 0) goto LAB_00b50299;
    if (uVar8 == 0) {
      lVar16 = 0;
LAB_00b50398:
      if (uVar17 - lVar16 == 0) goto LAB_00b503a0;
      cVar5 = utf8::ByteIndexIntoCharacterIndex
                        ((LPCUTF8)(canonicalized + lVar16 + -8),uVar17 - lVar16,doDefault);
      uVar15 = cVar5 + (int)lVar16;
      if (uVar15 <= uVar8) {
        utf8::DecodeUnitsIntoAndNullTerminateNoAdvance
                  (content + lVar16,(LPCUTF8)(canonicalized + lVar16 + -8),
                   (LPCUTF8)(canonicalized + (uVar17 - 8)),doAllowInvalidWCHARs,(bool *)0x0);
        if (content[uVar15] != L'\0') {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar10 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Codex/Utf8Helper.h"
                                      ,0xaa,"(destString[*destCount] == 0)",
                                      "destString[*destCount] == 0");
          if (!bVar3) goto LAB_00b50497;
          *puVar10 = 0;
        }
        if (uVar15 != uVar8) goto LAB_00b5029f;
        goto LAB_00b503a7;
      }
      goto LAB_00b5029f;
    }
    uVar14 = 0;
    do {
      if (canonicalized[uVar14 - 8] < '\x01') {
        lVar16 = 0;
        if (2 < uVar14) {
          lVar16 = uVar14 - 3;
        }
        goto LAB_00b50398;
      }
      content[uVar14] = (short)canonicalized[uVar14 - 8];
      uVar14 = uVar14 + 1;
    } while (uVar17 != uVar14);
LAB_00b503a0:
    content[uVar17] = L'\0';
  }
LAB_00b503a7:
  pJVar12 = JavascriptString::NewWithBuffer(content,uVar8,pSVar1);
LAB_00b503b9:
  if ((stack0xffffffffffffff88 != (void *)0x0) && ((char)langtag8.allocateCount == '\x01')) {
    free(stack0xffffffffffffff88);
  }
  return pJVar12;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_NormalizeLanguageTag(RecyclableObject* function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);

#if defined(INTL_ICU)
        INTL_CHECK_ARGS(args.Info.Count == 2 && VarIs<JavascriptString>(args[1]));

        UErrorCode status = U_ZERO_ERROR;
        JavascriptString *langtag = UnsafeVarTo<JavascriptString>(args[1]);
        utf8::WideToNarrow langtag8(langtag->GetSz(), langtag->GetLength());

        // ICU doesn't have a full-fledged canonicalization implementation that correctly replaces all preferred values
        // and grandfathered tags, as required by #sec-canonicalizelanguagetag.
        // However, passing the locale through uloc_forLanguageTag -> uloc_toLanguageTag gets us most of the way there
        // by replacing some(?) values, correctly capitalizing the tag, and re-ordering extensions
        int parsedLength = 0;
        char localeID[ULOC_FULLNAME_CAPACITY] = { 0 };
        int forLangTagResultLength = uloc_forLanguageTag(langtag8, localeID, ULOC_FULLNAME_CAPACITY, &parsedLength, &status);
        AssertOrFailFast(parsedLength >= 0);
        if (status == U_ILLEGAL_ARGUMENT_ERROR || ((charcount_t) parsedLength) < langtag->GetLength())
        {
            // The string passed in to NormalizeLanguageTag has already passed IsStructurallyValidLanguageTag.
            // However, duplicate unicode extension keys, such as "de-u-co-phonebk-co-phonebk", are structurally
            // valid according to RFC5646 yet still trigger U_ILLEGAL_ARGUMENT_ERROR
            // V8 ~6.2 says that the above language tag is invalid, while SpiderMonkey ~58 handles it.
            // Until we have a more spec-compliant implementation of CanonicalizeLanguageTag, err on the side
            // of caution and say it is invalid.
            // We also check for parsedLength < langtag->GetLength() because there are cases when status == U_ZERO_ERROR
            // but the langtag was not valid, such as "en-tesTER-TESter" (OSS-Fuzz #6657).
            // NOTE: make sure we check for `undefined` at the platform.normalizeLanguageTag callsite.
            return scriptContext->GetLibrary()->GetUndefined();
        }

        // forLangTagResultLength can be 0 if langtag is "und".
        // uloc_toLanguageTag("") returns "und", so this works out (forLanguageTag can return >= 0 but toLanguageTag must return > 0)
        ICU_ASSERT(status, forLangTagResultLength >= 0 && ((charcount_t) parsedLength) == langtag->GetLength());

        char canonicalized[ULOC_FULLNAME_CAPACITY] = { 0 };
        int toLangTagResultLength = uloc_toLanguageTag(localeID, canonicalized, ULOC_FULLNAME_CAPACITY, true, &status);
        ICU_ASSERT(status, toLangTagResultLength > 0);

        // allocate toLangTagResultLength + 1 to leave room for null terminator
        char16 *canonicalized16 = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, toLangTagResultLength + 1);
        charcount_t canonicalized16Len = 0;
        HRESULT hr = utf8::NarrowStringToWideNoAlloc(
            canonicalized,
            toLangTagResultLength,
            canonicalized16,
            toLangTagResultLength + 1,
            &canonicalized16Len
        );
        AssertOrFailFast(hr == S_OK && ((int) canonicalized16Len) == toLangTagResultLength);

        return JavascriptString::NewWithBuffer(canonicalized16, toLangTagResultLength, scriptContext);
#else
        if (args.Info.Count < 2 || !VarIs<JavascriptString>(args.Values[1]))
        {
            // NormalizeLanguageTag of undefined or non-string is undefined
            return scriptContext->GetLibrary()->GetUndefined();
        }

        JavascriptString *argString = VarTo<JavascriptString>(args.Values[1]);
        JavascriptString *retVal;
        HRESULT hr;
        AutoHSTRING str;
        hr = GetWindowsGlobalizationAdapter(scriptContext)->NormalizeLanguageTag(scriptContext, argString->GetSz(), &str);
        DelayLoadWindowsGlobalization *wsl = scriptContext->GetThreadContext()->GetWindowsGlobalizationLibrary();
        PCWSTR strBuf = wsl->WindowsGetStringRawBuffer(*str, NULL);
        retVal = Js::JavascriptString::NewCopySz(strBuf, scriptContext);
        if (FAILED(hr))
        {
            HandleOOMSOEHR(hr);
            //If we can't normalize the tag; return undefined.
            return scriptContext->GetLibrary()->GetUndefined();
        }

        return retVal;
#endif
    }